

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_bss_decoder.hpp
# Opt level: O2

void __thiscall duckdb::BssDecoder::Skip<double>(BssDecoder *this,uint32_t batch_size)

{
  ostream *poVar1;
  runtime_error *this_00;
  string local_1c0 [32];
  stringstream error;
  ostream local_190 [376];
  
  if (((this->buffer_).len & 7) == 0) {
    ByteBuffer::available(&this->buffer_,(ulong)(this->value_offset_ + batch_size) << 3);
    this->value_offset_ = this->value_offset_ + batch_size;
    return;
  }
  ::std::__cxx11::stringstream::stringstream((stringstream *)&error);
  poVar1 = ::std::operator<<(local_190,"Data buffer size for the BYTE_STREAM_SPLIT encoding (");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = ::std::operator<<(poVar1,") should be a multiple of the type size (");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::operator<<(poVar1,")");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::stringbuf::str();
  ::std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Skip(uint32_t batch_size) {
		if (buffer_.len % sizeof(T) != 0) {
			std::stringstream error;
			error << "Data buffer size for the BYTE_STREAM_SPLIT encoding (" << buffer_.len
			      << ") should be a multiple of the type size (" << sizeof(T) << ")";
			throw std::runtime_error(error.str());
		}
		buffer_.available((value_offset_ + batch_size) * sizeof(T));
		value_offset_ += batch_size;
	}